

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# W3CPropagator.h
# Opt level: O0

TraceID __thiscall
jaegertracing::propagation::
W3CPropagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
::readTraceID(W3CPropagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
              *this,istream *in)

{
  ulong uVar1;
  long lVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  unsigned_long low_00;
  char in_R8B;
  unsigned_long low;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  undefined1 local_e0 [8];
  string lowStr;
  unsigned_long high;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  undefined1 local_a0 [8];
  string highStr;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  beginLowStr;
  undefined1 local_60 [8];
  string buffer;
  size_t kMaxChars;
  TraceID traceID;
  istream *in_local;
  W3CPropagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
  *this_local;
  
  traceID._low = (uint64_t)in;
  TraceID::TraceID((TraceID *)&kMaxChars);
  buffer.field_2._8_8_ = 0x20;
  utils::HexParsing::readSegment_abi_cxx11_
            ((string *)local_60,(HexParsing *)traceID._low,(istream *)0x20,0x2d,in_R8B);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    lVar2 = std::__cxx11::string::size();
    if (lVar2 == 0x20) {
      highStr.field_2._8_8_ =
           std::end<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60)
      ;
      _Var3 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator-((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)&highStr.field_2 + 8),0x10);
      local_a8._M_current =
           (char *)std::begin<std::__cxx11::string>
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_60);
      local_b0 = _Var3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                ((string *)local_a0,local_a8,local_b0,(allocator<char> *)((long)&high + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&high + 7));
      lowStr.field_2._8_8_ = utils::HexParsing::decodeHex<unsigned_long>((string *)local_a0);
      local_e8 = _Var3;
      local_f0._M_current =
           (char *)std::end<std::__cxx11::string>
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_60);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                ((string *)local_e0,local_e8,local_f0,(allocator<char> *)((long)&low + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&low + 7));
      low_00 = utils::HexParsing::decodeHex<unsigned_long>((string *)local_e0);
      TraceID::TraceID((TraceID *)&this_local,lowStr.field_2._8_8_,low_00);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)local_a0);
      goto LAB_00318e9a;
    }
  }
  TraceID::TraceID((TraceID *)&this_local);
LAB_00318e9a:
  std::__cxx11::string::~string((string *)local_60);
  return _this_local;
}

Assistant:

TraceID readTraceID(std::istream& in) const
    {
        TraceID traceID;
        constexpr auto kMaxChars = static_cast<size_t>(32);
        auto buffer = utils::HexParsing::readSegment(in, kMaxChars, '-');

        if (buffer.empty() || buffer.size() != kMaxChars) {
            return TraceID();
        }

        auto beginLowStr = std::end(buffer) - kMaxChars / 2;
        const std::string highStr(std::begin(buffer), beginLowStr);
        auto high = utils::HexParsing::decodeHex<uint64_t>(highStr);
        const std::string lowStr(beginLowStr, std::end(buffer));
        auto low = utils::HexParsing::decodeHex<uint64_t>(lowStr);

        return TraceID(high, low);
    }